

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QRectF * __thiscall QVariant::toRectF(QVariant *this)

{
  QRectF *in_RDI;
  QVariant *unaff_retaddr;
  
  qvariant_cast<QRectF>(unaff_retaddr);
  return in_RDI;
}

Assistant:

QRectF QVariant::toRectF() const
{
    return qvariant_cast<QRectF>(*this);
}